

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskflow.hpp
# Opt level: O3

void __thiscall tf::Taskflow::_dump(Taskflow *this,ostream *os,Graph *graph,Dumper *dumper)

{
  Node *node;
  size_type sVar1;
  mapped_type mVar2;
  _Hashtable<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  ostream *poVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  pointer puVar7;
  Graph *module;
  key_type local_78;
  Dumper *local_70;
  pair<const_tf::Node_*,_const_tf::Graph_*> local_68;
  deque<std::pair<tf::Node_const*,tf::Graph_const*>,std::allocator<std::pair<tf::Node_const*,tf::Graph_const*>>>
  *local_58;
  _Hashtable<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_50;
  Graph *local_48;
  Taskflow *local_40;
  pointer local_38;
  
  puVar7 = (graph->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar7 != (graph->
                super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                ).
                super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    local_50 = &(dumper->visited)._M_h;
    local_58 = (deque<std::pair<tf::Node_const*,tf::Graph_const*>,std::allocator<std::pair<tf::Node_const*,tf::Graph_const*>>>
                *)&dumper->stack;
    local_70 = dumper;
    local_48 = graph;
    local_40 = this;
    do {
      node = (puVar7->_M_t).super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
      if (*(__index_type *)
           ((long)&(node->_handle).
                   super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           + 0x38) == '\x06') {
        local_78 = *(key_type *)
                    &(node->_handle).
                     super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
        ;
        local_68.first = (Node *)CONCAT71(local_68.first._1_7_,0x70);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_68,1);
        poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"[shape=box3d, color=blue, label=\"",0x21);
        sVar1 = (node->_name)._M_string_length;
        if (sVar1 == 0) {
          local_68.first = (Node *)CONCAT71(local_68.first._1_7_,0x70);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_68,1);
          std::ostream::_M_insert<void_const*>(poVar3);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    (os,(node->_name)._M_dataplus._M_p,sVar1);
        }
        this_00 = local_50;
        local_38 = puVar7;
        iVar4 = std::
                _Hashtable<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(local_50,&local_78);
        if (iVar4.super__Node_iterator_base<std::pair<const_tf::Graph_*const,_unsigned_long>,_false>
            ._M_cur == (__node_type *)0x0) {
          mVar2 = local_70->id;
          local_70->id = mVar2 + 1;
          pmVar5 = std::__detail::
                   _Map_base<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this_00,&local_78);
          *pmVar5 = mVar2;
          local_68.second = local_78;
          local_68.first = node;
          std::
          deque<std::pair<tf::Node_const*,tf::Graph_const*>,std::allocator<std::pair<tf::Node_const*,tf::Graph_const*>>>
          ::emplace_back<std::pair<tf::Node_const*,tf::Graph_const*>>(local_58,&local_68);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os," [m",3);
        std::__detail::
        _Map_base<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
        ::operator[]((_Map_base<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)this_00,&local_78);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)os);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]\"];\n",5);
        graph = local_48;
        puVar7 = local_38;
        if (node->_num_successors != 0) {
          uVar6 = 0;
          do {
            local_68.first._0_1_ = 0x70;
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_68,1);
            poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"->",2);
            local_68.first = (Node *)CONCAT71(local_68.first._1_7_,0x70);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_68,1);
            poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,";\n",2);
            uVar6 = uVar6 + 1;
            graph = local_48;
            puVar7 = local_38;
          } while (uVar6 < node->_num_successors);
        }
      }
      else {
        _dump(local_40,os,node,local_70);
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != (graph->
                       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                       ).
                       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

inline void Taskflow::_dump(
  std::ostream& os, const Graph* graph, Dumper& dumper
) const {

  for(auto itr = graph->begin(); itr != graph->end(); ++itr) {

    Node* n = itr->get();

    // regular task
    if(n->_handle.index() != Node::MODULE) {
      _dump(os, n, dumper);
    }
    // module task
    else {
      //auto module = &(std::get_if<Node::Module>(&n->_handle)->module);
      auto module = &(std::get_if<Node::Module>(&n->_handle)->graph);

      os << 'p' << n << "[shape=box3d, color=blue, label=\"";
      if(n->_name.empty()) os << 'p' << n;
      else os << n->_name;

      if(dumper.visited.find(module) == dumper.visited.end()) {
        dumper.visited[module] = dumper.id++;
        dumper.stack.push({n, module});
      }

      os << " [m" << dumper.visited[module] << "]\"];\n";

      //for(const auto s : n->_successors) {
      for(size_t i=0; i<n->_num_successors; ++i) {
        os << 'p' << n << "->" << 'p' << n->_edges[i] << ";\n";
      }
    }
  }
}